

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

qpTestResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::ValidateFramebuffer
          (ClipControlDepthModeZeroToOneTest *this,Context *context)

{
  TestLog *log;
  RenderContext *pRVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int y;
  qpTestResult qVar7;
  int x;
  int x_00;
  float fVar8;
  float fVar9;
  float fVar10;
  Surface renderedColorFrame;
  TextureFormat depthFormat;
  Surface referenceColorFrame;
  PixelBufferAccess local_d0;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  TextureLevel importanceMaskFrame;
  
  iVar4 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar4);
  iVar4 = ((int *)CONCAT44(extraout_var,iVar4))[1];
  tcu::Surface::Surface(&renderedColorFrame,iVar5,iVar4);
  tcu::Surface::Surface(&referenceColorFrame,iVar5,iVar4);
  depthFormat.order = D;
  depthFormat.type = FLOAT;
  tcu::TextureLevel::TextureLevel(&renderedDepthFrame,&depthFormat,iVar5,iVar4,1);
  tcu::TextureLevel::TextureLevel(&referenceDepthFrame,&depthFormat,iVar5,iVar4,1);
  tcu::TextureLevel::TextureLevel(&importanceMaskFrame,&depthFormat,iVar5,iVar4,1);
  log = context->m_testCtx->m_log;
  fVar8 = 2.0 / (float)renderedColorFrame.m_width + 2.0 / (float)renderedColorFrame.m_height;
  iVar5 = renderedColorFrame.m_width;
  for (iVar4 = 0; iVar4 < renderedColorFrame.m_height; iVar4 = iVar4 + 1) {
    fVar9 = ((float)iVar4 + 0.5) / (float)renderedColorFrame.m_height;
    for (x_00 = 0; x_00 < iVar5; x_00 = x_00 + 1) {
      fVar10 = ((float)x_00 + 0.5) / (float)iVar5;
      fVar2 = 1.0 - fVar10;
      if ((fVar9 < fVar2 - fVar8) || (fVar2 + fVar8 < fVar9)) {
        tcu::TextureLevel::getAccess(&local_d0,&importanceMaskFrame);
        tcu::PixelBufferAccess::setPixDepth(&local_d0,1.0,x_00,iVar4,0);
      }
      else {
        tcu::TextureLevel::getAccess(&local_d0,&importanceMaskFrame);
        tcu::PixelBufferAccess::setPixDepth(&local_d0,0.0,x_00,iVar4,0);
      }
      lVar6 = (long)(referenceColorFrame.m_width * iVar4 + x_00);
      if (fVar2 <= fVar9) {
        *(undefined4 *)((long)referenceColorFrame.m_pixels.m_ptr + lVar6 * 4) = 0xff00ff00;
        tcu::TextureLevel::getAccess(&local_d0,&referenceDepthFrame);
        tcu::PixelBufferAccess::setPixDepth(&local_d0,fVar10 + -1.0 + fVar9,x_00,iVar4,0);
      }
      else {
        *(undefined4 *)((long)referenceColorFrame.m_pixels.m_ptr + lVar6 * 4) = 0xff0000ff;
        tcu::TextureLevel::getAccess(&local_d0,&referenceDepthFrame);
        tcu::PixelBufferAccess::setPixDepth(&local_d0,0.5,x_00,iVar4,0);
      }
      iVar5 = renderedColorFrame.m_width;
    }
  }
  pRVar1 = context->m_renderCtx;
  tcu::Surface::getAccess(&local_d0,&renderedColorFrame);
  glu::readPixels(pRVar1,0,0,&local_d0);
  qVar7 = QP_TEST_RESULT_FAIL;
  bVar3 = tcu::fuzzyCompare(log,"Result","Color image comparison result",&referenceColorFrame,
                            &renderedColorFrame,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    pRVar1 = context->m_renderCtx;
    tcu::TextureLevel::getAccess(&local_d0,&renderedDepthFrame);
    glu::readPixels(pRVar1,0,0,&local_d0);
    bVar3 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&this->super_ClipControlRenderBaseTest,log,"Result",
                       "Depth image comparison result",&referenceDepthFrame,&renderedDepthFrame,0.05
                       ,&importanceMaskFrame);
    qVar7 = (qpTestResult)!bVar3;
  }
  tcu::TextureLevel::~TextureLevel(&importanceMaskFrame);
  tcu::TextureLevel::~TextureLevel(&referenceDepthFrame);
  tcu::TextureLevel::~TextureLevel(&renderedDepthFrame);
  tcu::Surface::~Surface(&referenceColorFrame);
  tcu::Surface::~Surface(&renderedColorFrame);
  return qVar7;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 importanceMaskFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		const float rasterizationError =
			2.0f / (float)renderedColorFrame.getHeight() + 2.0f / (float)renderedColorFrame.getWidth();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = ((float)(y) + 0.5f) / (float)renderedColorFrame.getHeight();

			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = ((float)(x) + 0.5f) / (float)renderedColorFrame.getWidth();

				if (yCoord >= 1.0 - xCoord - rasterizationError && yCoord <= 1.0 - xCoord + rasterizationError)
				{
					importanceMaskFrame.getAccess().setPixDepth(0.0f, x, y);
				}
				else
				{
					importanceMaskFrame.getAccess().setPixDepth(1.0f, x, y);
				}

				if (yCoord < 1.0 - xCoord)
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::red());
					referenceDepthFrame.getAccess().setPixDepth(0.5f, x, y);
				}
				else
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::green());

					referenceDepthFrame.getAccess().setPixDepth(-1.0f + xCoord + yCoord, x, y);
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f, &importanceMaskFrame))
		{
			return QP_TEST_RESULT_FAIL;
		}
		return QP_TEST_RESULT_PASS;
	}